

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::AnnounceBegin
          (Error *__return_storage_ptr__,CommissionerApp *this,uint32_t aChannelMask,uint8_t aCount,
          MilliSeconds aPeriod,string *aDtsAddr)

{
  byte bVar1;
  uint uVar2;
  element_type *peVar3;
  ulong uVar4;
  Error *aError;
  basic_string_view<char> bVar5;
  format_args args;
  string_view fmt;
  ErrorCode local_174;
  Error local_170;
  anon_class_1_0_00000001 local_142;
  v10 local_141;
  v10 *local_140;
  size_t local_138;
  string local_130;
  Error local_110;
  undefined1 local_d1;
  string *local_d0;
  string *aDtsAddr_local;
  uint8_t aCount_local;
  CommissionerApp *pCStack_c0;
  uint32_t aChannelMask_local;
  CommissionerApp *this_local;
  MilliSeconds aPeriod_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_d1 = 0;
  local_d0 = aDtsAddr;
  aDtsAddr_local._3_1_ = aCount;
  aDtsAddr_local._4_4_ = aChannelMask;
  pCStack_c0 = this;
  this_local = (CommissionerApp *)aPeriod.__r;
  aPeriod_local.__r = (rep)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    AnnounceBegin::anon_class_1_0_00000001::operator()(&local_142);
    local_58 = &local_140;
    local_60 = &local_141;
    bVar5 = ::fmt::v10::operator()(local_60);
    local_138 = bVar5.size_;
    local_140 = (v10 *)bVar5.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_130;
    local_78 = local_140;
    sStack_70 = local_138;
    local_50 = &local_78;
    local_88 = local_140;
    local_80 = local_138;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )aDtsAddr;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_130,local_88,fmt,args);
    Error::Error(&local_110,kInvalidState,&local_130);
    Error::operator=(__return_storage_ptr__,&local_110);
    Error::~Error(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    uVar2 = aDtsAddr_local._4_4_;
    bVar1 = aDtsAddr_local._3_1_;
    uVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
    (*peVar3->_vptr_Commissioner[0x2c])
              (&local_170,peVar3,(ulong)uVar2,(ulong)bVar1,uVar4 & 0xffff,local_d0);
    aError = Error::operator=(__return_storage_ptr__,&local_170);
    local_174 = kNone;
    commissioner::operator!=(aError,&local_174);
    Error::~Error(&local_170);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::AnnounceBegin(uint32_t           aChannelMask,
                                     uint8_t            aCount,
                                     MilliSeconds       aPeriod,
                                     const std::string &aDtsAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    SuccessOrExit(error = mCommissioner->AnnounceBegin(aChannelMask, aCount, aPeriod.count(), aDtsAddr));

exit:
    return error;
}